

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

ostream * operator<<(ostream *os,PlayerState state)

{
  PlayerState state_local;
  ostream *os_local;
  
  switch(state) {
  case ATTACKING:
    std::operator<<(os,"Attacking");
    break;
  case DEFENDING:
    std::operator<<(os,"Defending");
    break;
  case FORTIFYING:
    std::operator<<(os,"Fortifying");
    break;
  case REINFORCING:
    std::operator<<(os,"Reinforcing");
    break;
  case IDLE:
    std::operator<<(os,"Idle");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const PlayerState state) {
    switch (state) {
        case ATTACKING:
            os << "Attacking";
            break;
        case DEFENDING:
            os << "Defending";
            break;
        case FORTIFYING:
            os << "Fortifying";
            break;
        case REINFORCING:
            os << "Reinforcing";
            break;
        case IDLE:
            os << "Idle";
            break;
    }
    return os;
}